

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O2

Vec_Int_t * Llb_Nonlin4SweepOrder(Aig_Man_t *pAig,int *pCounter,int fSaveAll)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vOrder;
  void *pvVar3;
  Aig_Obj_t *pObj;
  int iVar4;
  int Counter;
  int local_3c;
  int *local_38;
  
  local_3c = 0;
  iVar4 = pAig->vObjs->nSize;
  local_38 = pCounter;
  vOrder = Vec_IntAlloc(iVar4);
  vOrder->nSize = iVar4;
  memset(vOrder->pArray,0xff,(long)iVar4 << 2);
  Aig_ManIncrementTravId(pAig);
  pAig->pConst1->TravId = pAig->nTravIds;
  for (iVar4 = 0; iVar4 < pAig->vCos->nSize; iVar4 = iVar4 + 1) {
    pvVar3 = Vec_PtrEntry(pAig->vCos,iVar4);
    iVar1 = local_3c;
    local_3c = local_3c + 1;
    Vec_IntWriteEntry(vOrder,*(int *)((long)pvVar3 + 0x24),iVar1);
    Llb_Nonlin4SweepOrder_rec
              (pAig,(Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe),vOrder,
               &local_3c,fSaveAll);
  }
  for (iVar4 = 0; iVar4 < pAig->vCis->nSize; iVar4 = iVar4 + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,iVar4);
    iVar2 = Llb_ObjBddVar(vOrder,pObj);
    iVar1 = local_3c;
    if (iVar2 < 0) {
      local_3c = local_3c + 1;
      Vec_IntWriteEntry(vOrder,pObj->Id,iVar1);
    }
  }
  if (local_38 != (int *)0x0) {
    *local_38 = local_3c - (pAig->nObjs[2] + pAig->nObjs[3]);
  }
  return vOrder;
}

Assistant:

Vec_Int_t * Llb_Nonlin4SweepOrder( Aig_Man_t * pAig, int * pCounter, int fSaveAll )
{
    Vec_Int_t * vOrder;
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    // collect nodes in the order
    vOrder = Vec_IntStartFull( Aig_ManObjNumMax(pAig) );
    Aig_ManIncrementTravId( pAig );
    Aig_ObjSetTravIdCurrent( pAig, Aig_ManConst1(pAig) );
    Aig_ManForEachCo( pAig, pObj, i )
    {
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
        Llb_Nonlin4SweepOrder_rec( pAig, Aig_ObjFanin0(pObj), vOrder, &Counter, fSaveAll );
    }
    Aig_ManForEachCi( pAig, pObj, i )
        if ( Llb_ObjBddVar(vOrder, pObj) < 0 )
            Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
//    assert( Counter == Aig_ManObjNum(pAig) - 1 ); // no dangling nodes
    if ( pCounter )
        *pCounter = Counter - Aig_ManCiNum(pAig) - Aig_ManCoNum(pAig);
    return vOrder;
}